

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O1

void __thiscall PlasticBSDF::PlasticBSDF(PlasticBSDF *this,Json *conf)

{
  float fVar1;
  const_reference j;
  long lVar2;
  undefined **ppuVar3;
  int iVar4;
  float fVar5;
  undefined8 uVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  MT19937Sampler sampler;
  undefined **local_13a8 [625];
  undefined8 local_20;
  
  BSDF::BSDF(&this->super_BSDF,conf);
  (this->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_f_0016cb10;
  j = nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  *)conf,"ior");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (j,(float *)local_13a8);
  *(undefined4 *)&(this->super_BSDF).field_0x24 = local_13a8[0]._0_4_;
  local_13a8[0] = &PTR_get1f_0016bb78;
  local_13a8[1] = (undefined **)0x0;
  lVar2 = 2;
  ppuVar3 = (undefined **)0x0;
  do {
    ppuVar3 = (undefined **)
              (ulong)((((uint)((ulong)ppuVar3 >> 0x1e) ^ (uint)ppuVar3) * 0x6c078965 + (int)lVar2) -
                     1);
    local_13a8[lVar2] = ppuVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x271);
  local_20 = 0x270;
  iVar4 = 1000000;
  fVar1 = 0.0;
  do {
    uVar6 = (*(code *)local_13a8[0][5])(local_13a8);
    fVar8 = (float)((ulong)uVar6 >> 0x20);
    dVar7 = (double)((1.0 - (float)uVar6 * (float)uVar6) - fVar8 * fVar8);
    if (dVar7 <= 0.0) {
      dVar7 = 0.0;
    }
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    fVar5 = (float)dVar7;
    fVar10 = 1.0 / *(float *)&(this->super_BSDF).field_0x24;
    fVar8 = 1.0 - fVar5 * fVar5;
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar8 = fVar8 / fVar10;
    fVar9 = 1.0;
    if (fVar8 < 1.0) {
      fVar8 = 1.0 - fVar8 * fVar8;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar9 = (fVar10 * fVar5 - fVar8) / (fVar10 * fVar5 + fVar8);
      fVar8 = (fVar5 - fVar10 * fVar8) / (fVar10 * fVar8 + fVar5);
      fVar9 = (fVar8 * fVar8 + fVar9 * fVar9) * 0.5;
    }
    fVar1 = fVar1 + (1.0 - fVar9);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  this->outRatio = fVar1 / 1e+06;
  return;
}

Assistant:

PlasticBSDF(const Json& conf): BSDF(conf)
	{
		IOR = conf["ior"];
		// precompute outRatio
		// here bruteforcing to demonstrate its physical meaning
		// you can optimize by using approximating polynormial
		MT19937Sampler sampler;
		const int nsample = 1000000;
		double energy = 0; // use double here because accumulating process introduces lots of rounding error
		for (int i=0; i<nsample; ++i) {
			vec3f lambert_out = sampler.cosSampleHemisphereSurface();
			energy += 1 - DielectricBRDF::reflectivity(lambert_out.z, 1/IOR);
		}
		outRatio = energy / nsample;
	}